

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_string_primitive_withoutSuffix
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t tuple;
  int iVar1;
  size_t __n;
  size_t sVar2;
  _Bool *string_00;
  uint8_t *stringData;
  uint8_t *suffixData;
  size_t stringSize;
  size_t suffixLen;
  sysbvm_tuple_t suffix;
  sysbvm_tuple_t string;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  context_local = (sysbvm_context_t *)*arguments;
  tuple = arguments[1];
  __n = sysbvm_tuple_getSizeInBytes(tuple);
  if ((__n != 0) &&
     (sVar2 = sysbvm_tuple_getSizeInBytes((sysbvm_tuple_t)context_local), __n <= sVar2)) {
    string_00 = &(context_local->heap).shouldAttemptToCollect;
    iVar1 = memcmp(string_00 + (sVar2 - __n),(void *)(tuple + 0x10),__n);
    if (iVar1 == 0) {
      context_local =
           (sysbvm_context_t *)sysbvm_string_createWithString(context,sVar2 - __n,string_00);
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_string_primitive_withoutSuffix(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t string = arguments[0];
    sysbvm_tuple_t suffix = arguments[1];

    size_t suffixLen = sysbvm_tuple_getSizeInBytes(suffix);
    if(suffixLen == 0)
        return string;

    size_t stringSize = sysbvm_tuple_getSizeInBytes(string);
    if(stringSize < suffixLen)
        return string;
    
    uint8_t *suffixData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(suffix)->bytes;
    uint8_t *stringData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes;
    if(memcmp(stringData + stringSize - suffixLen, suffixData, suffixLen))
        return string;

    return sysbvm_string_createWithString(context, stringSize - suffixLen, (const char*)(stringData));
}